

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

void clunk::ClearSlide(int from,int dir)

{
  char *pcVar1;
  int iVar2;
  
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x304,"void clunk::ClearSlide(const int, const int)");
  }
  pcVar1 = (char *)(&_board)[(uint)from];
  if (pcVar1 < _FIRST_SLIDER) {
    __assert_fail("_board[from] >= _FIRST_SLIDER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x305,"void clunk::ClearSlide(const int, const int)");
  }
  if (5 < (byte)(*pcVar1 - 6U)) {
    __assert_fail("IS_SLIDER(_board[from]->type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x306,"void clunk::ClearSlide(const int, const int)");
  }
  if ((uint)(byte)pcVar1[1] == from) {
    iVar2 = DirShift(dir);
    *(ulong *)(_atk + (ulong)(uint)from * 8 + 0x40) =
         *(ulong *)(_atk + (ulong)(uint)from * 8 + 0x40) & ~(0xffL << ((byte)iVar2 & 0x3f));
    return;
  }
  __assert_fail("_board[from]->sqr == from",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                ,0x307,"void clunk::ClearSlide(const int, const int)");
}

Assistant:

inline void ClearSlide(const int from, const int dir) {
  assert(IS_SQUARE(from));
  assert(_board[from] >= _FIRST_SLIDER);
  assert(IS_SLIDER(_board[from]->type));
  assert(_board[from]->sqr == from);
  _atk[from + 8] &= ~(0xFFULL << DirShift(dir));
}